

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O3

int cuddZddSymmCheck(DdManager *table,int x,int y)

{
  anon_union_16_2_50f58667_for_type *paVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  DdSubtable *pDVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  
  pDVar3 = table->zero;
  pDVar4 = table->subtableZ;
  iVar9 = 0;
  uVar8 = pDVar4[x].slots - 1;
  iVar10 = 0;
  if (-1 < (int)uVar8) {
    DVar2 = table->invpermZ[y];
    bVar7 = true;
    iVar10 = 0;
    bVar6 = true;
    uVar11 = (ulong)uVar8;
    do {
      for (pDVar12 = pDVar4[x].nodelist[uVar11]; pDVar12 != (DdNode *)0x0; pDVar12 = pDVar12->next)
      {
        pDVar14 = (pDVar12->type).kids.T;
        pDVar16 = (pDVar12->type).kids.E;
        if (pDVar14->index == DVar2) {
          pDVar15 = (pDVar14->type).kids.T;
          pDVar14 = (pDVar14->type).kids.E;
          iVar10 = iVar10 + (uint)(pDVar14 != pDVar3);
          pDVar13 = pDVar3;
          if (pDVar16->index == DVar2) goto LAB_009286ba;
        }
        else {
          pDVar15 = pDVar3;
          if (pDVar16->index != DVar2) {
            return 0;
          }
LAB_009286ba:
          paVar1 = &pDVar16->type;
          pDVar16 = (pDVar16->type).kids.E;
          iVar10 = iVar10 + (uint)(pDVar16 != pDVar3);
          pDVar13 = (paVar1->kids).T;
        }
        if (pDVar13 != pDVar14) {
          bVar6 = false;
        }
        if (pDVar15 != pDVar16) {
          bVar7 = false;
        }
        if (!bVar6 && !bVar7) {
          return 0;
        }
      }
      bVar5 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar5);
  }
  uVar8 = pDVar4[y].slots - 1;
  if (-1 < (int)uVar8) {
    iVar9 = 0;
    uVar11 = (ulong)uVar8;
    do {
      for (pDVar12 = pDVar4[y].nodelist[uVar11]; pDVar12 != (DdNode *)0x0; pDVar12 = pDVar12->next)
      {
        if ((pDVar12->type).kids.E != pDVar3) {
          iVar9 = iVar9 + pDVar12->ref;
        }
      }
      bVar6 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar6);
  }
  return (uint)(iVar10 == iVar9);
}

Assistant:

int
cuddZddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    int         i;
    DdNode      *f, *f0, *f1, *f01, *f00, *f11, *f10;
    int         yindex;
    int         xsymmy = 1;
    int         xsymmyp = 1;
    int         arccount = 0;
    int         TotalRefCount = 0;
    int         symm_found;

    empty = table->zero;

    yindex = table->invpermZ[y];
    for (i = table->subtableZ[x].slots - 1; i >= 0; i--) {
        f = table->subtableZ[x].nodelist[i];
        while (f != NULL) {
            /* Find f1, f0, f11, f10, f01, f00 */
            f1 = cuddT(f);
            f0 = cuddE(f);
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1);
                f10 = cuddE(f1);
                if (f10 != empty)
                    arccount++;
            } else {
                if ((int) f0->index != yindex) {
                    return(0); /* f bypasses layer y */
                }
                f11 = empty;
                f10 = f1;
            }
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0);
                f00 = cuddE(f0);
                if (f00 != empty)
                    arccount++;
            } else {
                f01 = empty;
                f00 = f0;
            }
            if (f01 != f10)
                xsymmy = 0;
            if (f11 != f00)
                xsymmyp = 0;
            if ((xsymmy == 0) && (xsymmyp == 0))
                return(0);

            f = f->next;
        } /* for each element of the collision list */
    } /* for each slot of the subtable */

    /* Calculate the total reference counts of y
    ** whose else arc is not empty.
    */
    for (i = table->subtableZ[y].slots - 1; i >= 0; i--) {
        f = table->subtableZ[y].nodelist[i];
        while (f != NIL(DdNode)) {
            if (cuddE(f) != empty)
                TotalRefCount += f->ref;
            f = f->next;
        }
    }

    symm_found = (arccount == TotalRefCount);
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (symm_found) {
        int xindex = table->invpermZ[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(symm_found);

}